

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t c4::yml::anon_unknown_0::_count_resolved_tags_size(Tree *t,size_t node)

{
  NodeType_e NVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  size_t sVar5;
  csubstr *pcVar6;
  size_t sVar7;
  size_t sVar8;
  
  sVar5 = Tree::first_child(t,node);
  if (sVar5 == 0xffffffffffffffff) {
    sVar8 = 0;
  }
  else {
    sVar8 = 0;
    do {
      if (t->m_cap <= sVar5) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          pcVar2 = (code *)swi(3);
          sVar5 = (*pcVar2)();
          return sVar5;
        }
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      NVar1 = t->m_buf[sVar5].m_type.type;
      uVar4 = (uint)NVar1;
      if ((NVar1 & KEY) != NOTYPE) {
        if (t->m_cap <= sVar5) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            sVar5 = (*pcVar2)();
            return sVar5;
          }
          (*(code *)PTR_error_impl_00247a78)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
          uVar4 = (uint)t->m_buf[sVar5].m_type.type;
        }
        if ((~uVar4 & 0x402) == 0) {
          pcVar6 = Tree::key_tag(t,sVar5);
          sVar7 = Tree::resolve_tag(t,(substr)ZEXT816(0),*pcVar6,sVar5);
          sVar8 = sVar8 + sVar7;
        }
      }
      if (t->m_cap <= sVar5) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          pcVar2 = (code *)swi(3);
          sVar5 = (*pcVar2)();
          return sVar5;
        }
        (*(code *)PTR_error_impl_00247a78)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      NVar1 = t->m_buf[sVar5].m_type.type;
      uVar4 = (uint)NVar1;
      if ((NVar1 & VAL) != NOTYPE) {
        if (t->m_cap <= sVar5) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            sVar5 = (*pcVar2)();
            return sVar5;
          }
          (*(code *)PTR_error_impl_00247a78)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
          uVar4 = (uint)t->m_buf[sVar5].m_type.type;
        }
        if ((uVar4 & 0xd) != 0 && (uVar4 >> 0xb & 1) != 0) {
          pcVar6 = Tree::val_tag(t,sVar5);
          sVar7 = Tree::resolve_tag(t,(substr)ZEXT816(0),*pcVar6,sVar5);
          sVar8 = sVar8 + sVar7;
        }
      }
      sVar7 = _count_resolved_tags_size(t,sVar5);
      sVar8 = sVar7 + sVar8;
      sVar5 = Tree::next_sibling(t,sVar5);
    } while (sVar5 != 0xffffffffffffffff);
  }
  return sVar8;
}

Assistant:

size_t _count_resolved_tags_size(Tree const* t, size_t node)
{
    size_t sz = 0;
    for(size_t child = t->first_child(node); child != NONE; child = t->next_sibling(child))
    {
        if(t->has_key(child) && t->has_key_tag(child))
            sz += t->resolve_tag(substr{}, t->key_tag(child), child);
        if(t->has_val(child) && t->has_val_tag(child))
            sz += t->resolve_tag(substr{}, t->val_tag(child), child);
        sz += _count_resolved_tags_size(t, child);
    }
    return sz;
}